

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.h
# Opt level: O2

shared_ptr<BER_CONTAINER> __thiscall
DynamicStringCallback::buildTypeWithValue(DynamicStringCallback *this)

{
  undefined8 uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<BER_CONTAINER> sVar2;
  undefined1 local_48 [56];
  
  (**(code **)(in_RSI + 0x18))(local_48 + 0x18);
  std::make_shared<OctetType,std::__cxx11::string_const>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  uVar1 = local_48._8_8_;
  local_48._8_8_ = 0;
  (this->super_ValueCallback)._vptr_ValueCallback = (_func_int **)local_48._0_8_;
  (this->super_ValueCallback).OID = (SortableOIDType *)uVar1;
  local_48._0_8_ = (pointer)0x0;
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  std::__cxx11::string::~string((string *)(local_48 + 0x18));
  sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<BER_CONTAINER>)
         sVar2.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BER_CONTAINER> buildTypeWithValue() override {
      return std::make_shared<OctetType>(m_callback());
    }